

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O1

void __thiscall
Minisat::Heap<int,_Minisat::Solver::VarOrderLt,_Minisat::MkIndexDefault<int>_>::percolateUp
          (Heap<int,_Minisat::Solver::VarOrderLt,_Minisat::MkIndexDefault<int>_> *this,int i)

{
  uint uVar1;
  Var x;
  int *piVar2;
  bool bVar3;
  int iVar4;
  
  x = (this->heap).data[i];
  if (i != 0) {
    do {
      uVar1 = i - 1;
      iVar4 = (int)uVar1 >> 1;
      bVar3 = Solver::VarOrderLt::operator()(&this->lt,x,(this->heap).data[iVar4]);
      if (!bVar3) break;
      piVar2 = (this->heap).data;
      piVar2[i] = piVar2[iVar4];
      if ((this->indices).map.sz <= piVar2[iVar4]) goto LAB_0010ee4d;
      (this->indices).map.data[piVar2[iVar4]] = i;
      i = iVar4;
    } while (1 < uVar1);
  }
  (this->heap).data[i] = x;
  if (x < (this->indices).map.sz) {
    (this->indices).map.data[x] = i;
    return;
  }
LAB_0010ee4d:
  __assert_fail("has(k)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/luciferxiaozhi[P]VertexCover_CNFSAT_/minisat/minisat/mtl/IntMap.h"
                ,0x28,
                "V &Minisat::IntMap<int, int>::operator[](K) [K = int, V = int, MkIndex = Minisat::MkIndexDefault<int>]"
               );
}

Assistant:

void percolateUp(int i)
    {
        K   x  = heap[i];
        int p  = parent(i);
        
        while (i != 0 && lt(x, heap[p])){
            heap[i]          = heap[p];
            indices[heap[p]] = i;
            i                = p;
            p                = parent(p);
        }
        heap   [i] = x;
        indices[x] = i;
    }